

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraBddMisc.c
# Opt level: O2

DdNode * Extra_bddComputeRangeCube(DdManager *dd,int iStart,int iStop)

{
  DdNode *n;
  ulong uVar1;
  DdNode *n_00;
  
  if (iStop < iStart) {
    __assert_fail("iStart <= iStop",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/bdd/extrab/extraBddMisc.c"
                  ,0x2bf,"DdNode *Extra_bddComputeRangeCube(DdManager *, int, int)");
  }
  if ((-1 < iStart) && (iStart <= dd->size)) {
    if (iStop <= dd->size) {
      n_00 = dd->one;
      Cudd_Ref(n_00);
      for (uVar1 = (ulong)(uint)iStart; (int)uVar1 < iStop; uVar1 = uVar1 + 1) {
        n = Cudd_bddAnd(dd,n_00,dd->vars[uVar1]);
        Cudd_Ref(n);
        Cudd_RecursiveDeref(dd,n_00);
        n_00 = n;
      }
      Cudd_Deref(n_00);
      return n_00;
    }
    __assert_fail("iStop >= 0 && iStop <= dd->size",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/bdd/extrab/extraBddMisc.c"
                  ,0x2c1,"DdNode *Extra_bddComputeRangeCube(DdManager *, int, int)");
  }
  __assert_fail("iStart >= 0 && iStart <= dd->size",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/bdd/extrab/extraBddMisc.c"
                ,0x2c0,"DdNode *Extra_bddComputeRangeCube(DdManager *, int, int)");
}

Assistant:

DdNode * Extra_bddComputeRangeCube( DdManager * dd, int iStart, int iStop )
{
    DdNode * bTemp, * bProd;
    int i;
    assert( iStart <= iStop );
    assert( iStart >= 0 && iStart <= dd->size );
    assert( iStop >= 0  && iStop  <= dd->size );
    bProd = b1;         Cudd_Ref( bProd );
    for ( i = iStart; i < iStop; i++ )
    {
        bProd = Cudd_bddAnd( dd, bTemp = bProd, dd->vars[i] );      Cudd_Ref( bProd );
        Cudd_RecursiveDeref( dd, bTemp ); 
    }
    Cudd_Deref( bProd );
    return bProd;
}